

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void RunLegalizeExtracts(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  int offset_00;
  VmModule *module_00;
  SynBase *pSVar1;
  Allocator *allocator;
  VariableData *container;
  undefined8 source;
  uint uVar2;
  VmFunction *pVVar3;
  VmBlock *pVVar4;
  VmValue **ppVVar5;
  VmConstant *pVVar6;
  VmInstruction *pVVar7;
  VmValue *pVVar8;
  TypeBase *pTVar9;
  VmConstant *address_00;
  TypeRef *structType;
  VmValue *pVVar10;
  VmValue *in_R9;
  VmType type;
  VmConstant *shiftAddress;
  VmConstant *address;
  VmFunction *function_1;
  VmValue *argument;
  int local_60;
  uint i;
  int pos;
  bool replaced;
  VmInstruction *targetAsInst;
  VmConstant *offset;
  VmValue *target;
  VmInstruction *curr_1;
  VmBlock *block;
  VmBlock *curr;
  VmFunction *function;
  VmValue *value_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar3 = getType<VmFunction>(value);
  if (pVVar3 == (VmFunction *)0x0) {
    pVVar4 = getType<VmBlock>(value);
    if (pVVar4 != (VmBlock *)0x0) {
      module->currentBlock = pVVar4;
      for (target = &pVVar4->firstInstruction->super_VmValue; target != (VmValue *)0x0;
          target = target[1].users.little[0]) {
        if (*(int *)&target[1]._vptr_VmValue == 0x4b) {
          ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]
                              ((SmallArray<VmValue_*,_4U> *)&target[1].typeID,0);
          pVVar10 = *ppVVar5;
          ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]
                              ((SmallArray<VmValue_*,_4U> *)&target[1].typeID,1);
          pVVar6 = getType<VmConstant>(*ppVVar5);
          pVVar7 = getType<VmInstruction>(pVVar10);
          if ((pVVar7 != (VmInstruction *)0x0) && (pVVar7->cmd == VM_INST_CONSTRUCT)) {
            i._3_1_ = false;
            local_60 = 0;
            for (argument._4_4_ = 0; uVar2 = SmallArray<VmValue_*,_4U>::size(&pVVar7->arguments),
                argument._4_4_ < uVar2; argument._4_4_ = argument._4_4_ + 1) {
              ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar7->arguments,argument._4_4_);
              function_1 = (VmFunction *)*ppVVar5;
              if ((pVVar6->iValue == local_60) &&
                 ((function_1->super_VmValue).type.size == (target->type).size)) {
                pVVar3 = getType<VmFunction>((VmValue *)function_1);
                if (pVVar3 != (VmFunction *)0x0) {
                  pVVar4->insertPoint = (VmInstruction *)target;
                  pTVar9 = VmType::Int.structType;
                  source = VmType::Int._0_8_;
                  module_00 = (VmModule *)target->source;
                  pVVar8 = anon_unknown.dwarf_c91b1::CreateFunctionAddress
                                     (module,target->source,pVVar3->function);
                  type.structType = (TypeBase *)pVVar8;
                  type._0_8_ = pTVar9;
                  function_1 = (VmFunction *)
                               anon_unknown.dwarf_c91b1::CreateBitcast
                                         ((anon_unknown_dwarf_c91b1 *)module,module_00,
                                          (SynBase *)source,type,in_R9);
                  pVVar4->insertPoint = pVVar4->lastInstruction;
                }
                anon_unknown.dwarf_c91b1::ReplaceValueUsersWith
                          (module,target,&function_1->super_VmValue,(uint *)0x0);
                i._3_1_ = SmallArray<VmValue_*,_8U>::empty(&target->users);
                break;
              }
              local_60 = (function_1->super_VmValue).type.size + local_60;
            }
            if (i._3_1_ != false) goto LAB_0024b228;
          }
          pSVar1 = target->source;
          pTVar9 = GetBaseType(ctx,pVVar10->type);
          address_00 = anon_unknown.dwarf_c91b1::CreateAlloca
                                 (ctx,module,pSVar1,pTVar9,"construct",true);
          FinalizeAlloca(ctx,module,address_00->container);
          pVVar4->insertPoint = (VmInstruction *)target;
          pSVar1 = target->source;
          pTVar9 = GetBaseType(ctx,pVVar10->type);
          anon_unknown.dwarf_c91b1::CreateStore
                    (ctx,module,pSVar1,pTVar9,&address_00->super_VmValue,pVVar10,0);
          allocator = module->allocator;
          pSVar1 = target->source;
          offset_00 = pVVar6->iValue;
          container = address_00->container;
          pTVar9 = GetBaseType(ctx,target->type);
          structType = ExpressionContext::GetReferenceType(ctx,pTVar9);
          pVVar6 = CreateConstantPointer
                             (allocator,pSVar1,offset_00,container,&structType->super_TypeBase,true)
          ;
          pSVar1 = target->source;
          pTVar9 = GetBaseType(ctx,target->type);
          in_R9 = (VmValue *)0x0;
          pVVar10 = anon_unknown.dwarf_c91b1::CreateLoad
                              (ctx,module,pSVar1,pTVar9,&pVVar6->super_VmValue,0);
          anon_unknown.dwarf_c91b1::ReplaceValueUsersWith(module,target,pVVar10,(uint *)0x0);
          pVVar4->insertPoint = pVVar4->lastInstruction;
        }
LAB_0024b228:
      }
      module->currentBlock = (VmBlock *)0x0;
    }
  }
  else {
    module->currentFunction = pVVar3;
    for (block = pVVar3->firstBlock; block != (VmBlock *)0x0; block = block->nextSibling) {
      RunLegalizeExtracts(ctx,module,&block->super_VmValue);
    }
    module->currentFunction = (VmFunction *)0x0;
  }
  return;
}

Assistant:

void RunLegalizeExtracts(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		module->currentFunction = function;

		for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
			RunLegalizeExtracts(ctx, module, curr);

		module->currentFunction = NULL;
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		module->currentBlock = block;

		for(VmInstruction *curr = block->firstInstruction; curr; curr = curr->nextSibling)
		{
			if(curr->cmd == VM_INST_EXTRACT)
			{
				VmValue *target = curr->arguments[0];
				VmConstant *offset = getType<VmConstant>(curr->arguments[1]);

				VmInstruction *targetAsInst = getType<VmInstruction>(target);

				if(targetAsInst && targetAsInst->cmd == VM_INST_CONSTRUCT)
				{
					bool replaced = false;

					int pos = 0;

					for(unsigned i = 0; i < targetAsInst->arguments.size(); i++)
					{
						VmValue *argument = targetAsInst->arguments[i];

						if(offset->iValue == pos && argument->type.size == curr->type.size)
						{
							if(VmFunction *function = getType<VmFunction>(argument))
							{
								block->insertPoint = curr;

								argument = CreateBitcast(module, curr->source, VmType::Int, CreateFunctionAddress(module, curr->source, function->function));

								block->insertPoint = block->lastInstruction;
							}

							ReplaceValueUsersWith(module, curr, argument, NULL);

							replaced = curr->users.empty();
							break;
						}

						pos += argument->type.size;
					}

					if(replaced)
						continue;
				}

				VmConstant *address = CreateAlloca(ctx, module, curr->source, GetBaseType(ctx, target->type), "construct", true);

				FinalizeAlloca(ctx, module, address->container);

				block->insertPoint = curr;

				CreateStore(ctx, module, curr->source, GetBaseType(ctx, target->type), address, target, 0);

				VmConstant *shiftAddress = CreateConstantPointer(module->allocator, curr->source, offset->iValue, address->container, ctx.GetReferenceType(GetBaseType(ctx, curr->type)), true);

				ReplaceValueUsersWith(module, curr, CreateLoad(ctx, module, curr->source, GetBaseType(ctx, curr->type), shiftAddress, 0), NULL);

				block->insertPoint = block->lastInstruction;
			}
		}

		module->currentBlock = NULL;
	}
}